

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegStreamReader.cpp
# Opt level: O1

int __thiscall MPEGStreamReader::flushPacket(MPEGStreamReader *this,AVPacket *avPacket)

{
  long lVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  long lVar4;
  long lVar5;
  int64_t iVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  ostream *poVar9;
  string message;
  long *local_60;
  long local_58;
  long local_50 [2];
  string local_40;
  
  this->m_eof = true;
  avPacket->codec = (BaseAbstractStreamReader *)this;
  avPacket->duration = 0;
  avPacket->data = (uint8_t *)0x0;
  avPacket->size = 0;
  avPacket->flags = (this->super_AbstractStreamReader).m_flags;
  avPacket->stream_index = (this->super_AbstractStreamReader).m_streamIndex;
  iVar7 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0xd])();
  avPacket->codecID = *(int *)CONCAT44(extraout_var,iVar7);
  lVar1 = (this->super_AbstractStreamReader).m_tmpBufferLen;
  if (0 < lVar1) {
    puVar2 = (this->super_AbstractStreamReader).m_curPos;
    puVar3 = this->m_tmpBuffer;
    (this->super_AbstractStreamReader).m_curPos = puVar3;
    (this->super_AbstractStreamReader).m_bufEnd = puVar3 + lVar1;
    uVar8 = bufFromNAL(this);
    if (uVar8 != 0) {
      this->m_shortStartCodes = uVar8 < 4;
      if (this->m_lastDecodedPos < puVar2 + uVar8) {
        this->m_lastDecodedPos = (uint8_t *)0x0;
        iVar7 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
                  _vptr_BaseAbstractStreamReader[0x1f])(this,puVar3 + uVar8);
        if (iVar7 != 0) goto LAB_001bebcc;
      }
    }
    avPacket->data = this->m_tmpBuffer;
    avPacket->size = (int32_t)(this->super_AbstractStreamReader).m_tmpBufferLen;
  }
LAB_001bebcc:
  lVar1 = (this->super_AbstractStreamReader).m_timeOffset;
  avPacket->pts = this->m_curPts + lVar1;
  lVar4 = this->m_curDts;
  lVar5 = this->m_pcrIncPerFrame;
  iVar7 = (*(this->super_AbstractStreamReader).super_BaseAbstractStreamReader.
            _vptr_BaseAbstractStreamReader[0x17])(this);
  avPacket->dts = (lVar1 + lVar4) - iVar7 * lVar5;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Processed ","");
  int32ToStr_abi_cxx11_(&local_40,&this->m_totalFrameNum);
  std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)&local_60);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_60,local_58);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  sLastMsg = true;
  this->m_processedBytes = this->m_processedBytes + (long)avPacket->size;
  iVar6 = (this->super_AbstractStreamReader).m_tmpBufferLen;
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return (int)iVar6;
}

Assistant:

int MPEGStreamReader::flushPacket(AVPacket& avPacket)
{
    m_eof = true;
    avPacket.codec = this;
    avPacket.duration = 0;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.flags = m_flags;
    avPacket.stream_index = m_streamIndex;
    avPacket.codecID = getCodecInfo().codecID;

    if (m_tmpBufferLen > 0)
    {
        const uint8_t* prevPos = m_curPos;
        m_curPos = m_tmpBuffer;
        m_bufEnd = m_tmpBuffer + m_tmpBufferLen;
        const int isNal = bufFromNAL();
        int decodeRez = 0;
        if (isNal)
        {
            m_shortStartCodes = isNal < 4;
            if ((prevPos + isNal) > m_lastDecodedPos)
            {
                m_lastDecodedPos = nullptr;
                decodeRez = decodeNal(m_curPos + isNal);
            }
        }
        if (decodeRez == 0)
        {
            avPacket.data = m_tmpBuffer;
            avPacket.size = static_cast<int>(m_tmpBufferLen);
        }
    }

    avPacket.pts = m_curPts + m_timeOffset;
    avPacket.dts = m_curDts + m_timeOffset - m_pcrIncPerFrame * getFrameDepth();  // shift dts back

    string message = "Processed ";
    message += int32ToStr(m_totalFrameNum);
    message += " video frames";
    LTRACE(LT_DEBUG, 0, message);
    LTRACE(LT_INFO, 2, message);
    m_processedBytes += avPacket.size;
    return static_cast<int>(m_tmpBufferLen);
}